

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O0

int Gia_WordFindFirstBit(uint uWord)

{
  int local_14;
  int i;
  uint uWord_local;
  
  local_14 = 0;
  while( true ) {
    if (0x1f < local_14) {
      return -1;
    }
    if ((uWord & 1 << ((byte)local_14 & 0x1f)) != 0) break;
    local_14 = local_14 + 1;
  }
  return local_14;
}

Assistant:

static inline int Gia_WordFindFirstBit( unsigned uWord )
{
    int i;
    for ( i = 0; i < 32; i++ )
        if ( uWord & (1 << i) )
            return i;
    return -1;
}